

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

pair<unsigned_long,_unsigned_long> httplib::detail::trim(char *b,char *e,size_t left,size_t right)

{
  char cVar1;
  size_t sVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  
  for (; (b + left < e && ((cVar1 = b[left], cVar1 == ' ' || (cVar1 == '\t')))); left = left + 1) {
  }
  do {
    sVar2 = right;
    if (sVar2 == 0) break;
    right = sVar2 - 1;
  } while ((b[sVar2 - 1] == ' ') || (b[sVar2 - 1] == '\t'));
  pVar3.second = sVar2;
  pVar3.first = left;
  return pVar3;
}

Assistant:

inline std::pair<size_t, size_t> trim(const char *b, const char *e, size_t left,
                                      size_t right) {
  while (b + left < e && is_space_or_tab(b[left])) {
    left++;
  }
  while (right > 0 && is_space_or_tab(b[right - 1])) {
    right--;
  }
  return std::make_pair(left, right);
}